

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::~COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
           *this,void **vtt)

{
  _func_int **pp_Var1;
  pointer ppIVar2;
  ITexture *pIVar3;
  u32 i;
  ulong uVar4;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IRenderTarget)._vptr_IRenderTarget = pp_Var1;
  *(void **)((long)&(this->super_IRenderTarget)._vptr_IRenderTarget + (long)pp_Var1[-3]) = vtt[3];
  if ((this->ColorAttachment != 0) && (this->BufferID != 0)) {
    (*GL.DeleteFramebuffers)(1,&this->BufferID);
  }
  for (uVar4 = 0;
      ppIVar2 = (this->super_IRenderTarget).Textures.m_data.
                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar4 < ((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                             super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3 &
              0xffffffff); uVar4 = uVar4 + 1) {
    pIVar3 = ppIVar2[uVar4];
    if (pIVar3 != (ITexture *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar3->_vptr_ITexture + (long)pIVar3->_vptr_ITexture[0xfffffffffffffffd]))
      ;
    }
  }
  pIVar3 = (this->super_IRenderTarget).DepthStencil;
  if (pIVar3 != (ITexture *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar3->_vptr_ITexture + (long)pIVar3->_vptr_ITexture[-3]));
  }
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             &(this->super_IRenderTarget).field_0x58);
  IRenderTarget::~IRenderTarget(&this->super_IRenderTarget,vtt + 1);
  return;
}

Assistant:

virtual ~COpenGLCoreRenderTarget()
	{
		if (ColorAttachment > 0 && BufferID != 0)
			Driver->irrGlDeleteFramebuffers(1, &BufferID);

		for (u32 i = 0; i < Textures.size(); ++i) {
			if (Textures[i])
				Textures[i]->drop();
		}

		if (DepthStencil)
			DepthStencil->drop();
	}